

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlv.cpp
# Opt level: O0

void __thiscall ot::commissioner::tlv::Tlv::Tlv(Tlv *this,Type aType,string *aValue,Scope aScope)

{
  allocator<unsigned_char> local_39;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  Scope local_21;
  string *psStack_20;
  Scope aScope_local;
  string *aValue_local;
  Tlv *pTStack_10;
  Type aType_local;
  Tlv *this_local;
  
  this->mScope = aScope;
  this->mType = aType;
  local_21 = aScope;
  psStack_20 = aValue;
  aValue_local._7_1_ = aType;
  pTStack_10 = this;
  local_30._M_current = (char *)std::__cxx11::string::begin();
  local_38._M_current = (char *)std::__cxx11::string::end();
  std::allocator<unsigned_char>::allocator(&local_39);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&this->mValue,local_30,local_38,
             &local_39);
  std::allocator<unsigned_char>::~allocator(&local_39);
  return;
}

Assistant:

Tlv::Tlv(Type aType, const std::string &aValue, Scope aScope)
    : mScope(aScope)
    , mType(aType)
    , mValue(aValue.begin(), aValue.end())
{
}